

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O2

void __thiscall
mocker::detail::RegisterAllocator::rewriteProgram
          (RegisterAllocator *this,
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          *toBeSpilled)

{
  size_type *this_00;
  __node_base_ptr p_Var1;
  Section *pSVar2;
  bool bVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __buckets_ptr pp_Var5;
  undefined8 uVar6;
  __type _Var7;
  shared_ptr<mocker::nasm::Register> *psVar8;
  const_iterator cVar9;
  long lVar10;
  iterator iVar11;
  shared_ptr<mocker::nasm::NumericConstant> *psVar12;
  _List_node_base *p_Var13;
  __shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *this_02;
  shared_ptr<mocker::nasm::MemoryAddr> *__args_1;
  mapped_type *__args_1_00;
  const_iterator cVar14;
  long lVar15;
  element_type *peVar16;
  long lVar17;
  bool bVar18;
  unsigned_long local_290;
  shared_ptr<mocker::nasm::BinaryInst> newSubRsp;
  shared_ptr<mocker::nasm::Inst> newInst;
  shared_ptr<mocker::nasm::Inst> inst_2;
  list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> lines;
  shared_ptr<mocker::nasm::BinaryInst> inst_1;
  undefined1 auStack_1f0 [8];
  RegSet s;
  undefined1 local_1a0 [40];
  __shared_ptr<mocker::nasm::Inst,(__gnu_cxx::_Lock_policy)2> local_178 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  __shared_ptr<mocker::nasm::Inst,(__gnu_cxx::_Lock_policy)2> local_168 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  int64_t alignSz;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150 [3];
  RegMap<std::shared_ptr<nasm::MemoryAddr>_> offsets;
  string local_100;
  string local_e0;
  Line local_c0;
  Line local_90;
  Line local_60;
  
  cVar14._M_node = (this->funcBeg)._M_node;
  this_00 = &offsets._M_h._M_bucket_count;
  do {
    cVar9._M_node = cVar14._M_node;
    if (cVar14._M_node == (this->funcEnd)._M_node) {
LAB_0012e74e:
      offsets._M_h._M_buckets = &offsets._M_h._M_single_bucket;
      offsets._M_h._M_bucket_count = 1;
      offsets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      offsets._M_h._M_element_count = 0;
      offsets._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      offsets._M_h._M_rehash_policy._M_next_resize = 0;
      offsets._M_h._M_single_bucket = (__node_base_ptr)0x0;
      if (cVar14._M_node == cVar9._M_node) {
        for (p_Var13 = (this->funcBeg)._M_node;
            (p_Var13 != cVar14._M_node && (p_Var13[3]._M_next == (_List_node_base *)0x0));
            p_Var13 = p_Var13->_M_next) {
        }
        cVar14._M_node = p_Var13->_M_next->_M_next;
        newSubRsp.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (((long)(toBeSpilled->
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(toBeSpilled->
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 1 & 0xfffffffffffffff7U) + 0x10);
        newInst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 4;
        psVar12 = (shared_ptr<mocker::nasm::NumericConstant> *)nasm::rsp();
        std::make_shared<mocker::nasm::NumericConstant,long&>((long *)&inst_1);
        std::
        make_shared<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>>
                  ((OpType *)&s,(shared_ptr<mocker::nasm::Register> *)&newInst,psVar12);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&inst_1.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        pSVar2 = this->section;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"",(allocator<char> *)&inst_1);
        std::__shared_ptr<mocker::nasm::Inst,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<mocker::nasm::BinaryInst,void>
                  (local_178,
                   (__shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2> *)&s);
        nasm::Line::Line(&local_c0,&local_100,(shared_ptr<mocker::nasm::Inst> *)local_178);
        std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
        emplace<mocker::nasm::Line>(&pSVar2->lines,cVar14,&local_c0);
        nasm::Line::~Line(&local_c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170);
        std::__cxx11::string::~string((string *)&local_100);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s._M_h._M_bucket_count);
        lVar10 = 0;
      }
      else {
        std::dynamic_pointer_cast<mocker::nasm::BinaryInst,mocker::nasm::Inst>
                  ((shared_ptr<mocker::nasm::Inst> *)&inst_1);
        std::dynamic_pointer_cast<mocker::nasm::NumericConstant,mocker::nasm::Addr>
                  ((shared_ptr<mocker::nasm::Addr> *)&s);
        p_Var1 = s._M_h._M_buckets[1];
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s._M_h._M_bucket_count);
        lVar10 = (long)(toBeSpilled->
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(toBeSpilled->
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 1;
        alignSz = (long)p_Var1 + (lVar10 - (ulong)((uint)lVar10 & 8)) + 0x10;
        std::__cxx11::string::string((string *)&s,(string *)(cVar14._M_node + 1));
        iVar11 = std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::erase
                           (&this->section->lines,cVar14);
        lines.super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl.
        _M_node.super__List_node_base._M_next =
             (_List_node_base *)
             CONCAT44(lines.
                      super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>.
                      _M_impl._M_node.super__List_node_base._M_next._4_4_,4);
        psVar12 = (shared_ptr<mocker::nasm::NumericConstant> *)nasm::rsp();
        std::make_shared<mocker::nasm::NumericConstant,long&>((long *)&newInst);
        std::
        make_shared<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>>
                  ((OpType *)&newSubRsp,(shared_ptr<mocker::nasm::Register> *)&lines,psVar12);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&newInst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        pSVar2 = this->section;
        std::__cxx11::string::string((string *)&local_e0,(string *)&s);
        std::__shared_ptr<mocker::nasm::Inst,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<mocker::nasm::BinaryInst,void>
                  (local_168,
                   &newSubRsp.
                    super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>);
        nasm::Line::Line(&local_90,&local_e0,(shared_ptr<mocker::nasm::Inst> *)local_168);
        std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
        emplace<mocker::nasm::Line>(&pSVar2->lines,(const_iterator)iVar11._M_node,&local_90);
        nasm::Line::~Line(&local_90);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&newSubRsp.
                    super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&s);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&inst_1.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        lVar10 = (long)(int)p_Var1;
      }
      lVar15 = (long)(toBeSpilled->
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(toBeSpilled->
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar10 = -lVar10;
      lVar17 = 0;
      while( true ) {
        lVar10 = lVar10 + -8;
        bVar18 = lVar15 == 0;
        lVar15 = lVar15 + -1;
        if (bVar18) break;
        psVar8 = nasm::rbp();
        inst_1.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)lVar10;
        std::
        make_shared<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Register>const&,unsigned_long>
                  ((shared_ptr<mocker::nasm::Register> *)&s,(unsigned_long *)psVar8);
        this_01 = &std::__detail::
                   _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&offsets,
                                (key_type *)
                                ((long)&(((toBeSpilled->
                                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->
                                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + lVar17))->
                   super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (this_01,(__shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2> *)&s)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s._M_h._M_bucket_count);
        lVar17 = lVar17 + 0x10;
      }
      lines.super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl.
      _M_node.super__List_node_base._M_next = (_List_node_base *)&lines;
      lines.super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl.
      _M_node._M_size = 0;
      lines.super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl.
      _M_node.super__List_node_base._M_prev =
           lines.super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl.
           _M_node.super__List_node_base._M_next;
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _Hashtable<__gnu_cxx::__normal_iterator<std::shared_ptr<mocker::nasm::Register>const*,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>>
                ((_Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&s,(toBeSpilled->
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                 (toBeSpilled->
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,0,&inst_1,&newSubRsp,&newInst);
      p_Var13 = (this->funcBeg)._M_node;
      local_290 = 0;
      while( true ) {
        cVar14._M_node = (this->funcEnd)._M_node;
        if (p_Var13 == cVar14._M_node) break;
        std::__shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&inst_2.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2> *)(p_Var13 + 3));
        if (inst_2.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
          emplace_back<mocker::nasm::Line_const&>
                    ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&lines,
                     (Line *)(p_Var13 + 1));
        }
        else {
          inst_1.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)auStack_1f0;
          inst_1.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
          auStack_1f0 = (undefined1  [8])0x0;
          nasm::getInvolvedRegs
                    ((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      *)(local_1a0 + 0x10),
                     (shared_ptr<mocker::nasm::Inst> *)
                     &inst_2.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>);
          uVar6 = local_1a0._24_8_;
          for (psVar8 = (shared_ptr<mocker::nasm::Register> *)local_1a0._16_8_;
              psVar8 != (shared_ptr<mocker::nasm::Register> *)uVar6; psVar8 = psVar8 + 1) {
            bVar18 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::shared_ptr<mocker::nasm::Register>>
                               (&s,psVar8);
            if (bVar18) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &newInst,&((psVar8->
                                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->identifier,"_");
              std::__cxx11::to_string((string *)&alignSz,local_290);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &newSubRsp,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &newInst,(string *)&alignSz);
              std::make_shared<mocker::nasm::Register,std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a0);
              std::__cxx11::string::~string((string *)&newSubRsp);
              std::__cxx11::string::~string((string *)&alignSz);
              std::__cxx11::string::~string((string *)&newInst);
              this_02 = &std::__detail::
                         _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&inst_1,psVar8)->
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
              local_290 = local_290 + 1;
              std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::operator=
                        (this_02,(__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *
                                 )local_1a0);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a0 + 8));
            }
          }
          std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     *)(local_1a0 + 0x10));
          nasm::getUsedRegs((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                             *)&newSubRsp,&inst_2);
          _Var4 = newSubRsp.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount;
          for (peVar16 = newSubRsp.
                         super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr; peVar16 != (element_type *)_Var4._M_pi;
              peVar16 = (element_type *)&peVar16->lhs) {
            bVar18 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::shared_ptr<mocker::nasm::Register>>
                               (&s,(shared_ptr<mocker::nasm::Register> *)peVar16);
            if (bVar18) {
              __args_1 = (shared_ptr<mocker::nasm::MemoryAddr> *)
                         std::__detail::
                         _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::at((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&inst_1,(key_type *)peVar16);
              std::__detail::
              _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::at((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)&offsets,(key_type *)peVar16);
              std::
              make_shared<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::MemoryAddr>&>
                        ((shared_ptr<mocker::nasm::Register> *)&newInst,__args_1);
              std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
              emplace_back<std::shared_ptr<mocker::nasm::Mov>&>
                        ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&lines,
                         (shared_ptr<mocker::nasm::Mov> *)&newInst);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&newInst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
            }
          }
          std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     *)&newSubRsp);
          nasm::replaceRegs((nasm *)&newInst,&inst_2,(RegMap<std::shared_ptr<Register>_> *)&inst_1);
          std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
          emplace_back<std::__cxx11::string_const&,std::shared_ptr<mocker::nasm::Inst>&>
                    ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&lines,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var13 + 1),&newInst);
          nasm::getDefinedRegs
                    ((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      *)&newSubRsp,&inst_2);
          _Var4 = newSubRsp.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount;
          for (peVar16 = newSubRsp.
                         super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr; peVar16 != (element_type *)_Var4._M_pi;
              peVar16 = (element_type *)&peVar16->lhs) {
            bVar18 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::shared_ptr<mocker::nasm::Register>>
                               (&s,(shared_ptr<mocker::nasm::Register> *)peVar16);
            if (bVar18) {
              __args_1_00 = std::__detail::
                            _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::at((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&offsets,(key_type *)peVar16);
              std::__detail::
              _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::at((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)&inst_1,(key_type *)peVar16);
              std::
              make_shared<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::MemoryAddr>&,std::shared_ptr<mocker::nasm::Register>&>
                        ((shared_ptr<mocker::nasm::MemoryAddr> *)&alignSz,
                         (shared_ptr<mocker::nasm::Register> *)__args_1_00);
              std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
              emplace_back<std::shared_ptr<mocker::nasm::Mov>&>
                        ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&lines,
                         (shared_ptr<mocker::nasm::Mov> *)&alignSz);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_150);
            }
          }
          std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     *)&newSubRsp);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&newInst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::
          _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&inst_1);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&inst_2.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        p_Var13 = p_Var13->_M_next;
      }
      iVar11 = std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::erase
                         (&this->section->lines,(this->funcBeg)._M_node,cVar14);
      (this->funcEnd)._M_node = iVar11._M_node;
      (this->funcBeg)._M_node = iVar11._M_node;
      p_Var13 = (_List_node_base *)&lines;
      bVar18 = false;
      while (p_Var13 = (((_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)
                        &p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var13 != (_List_node_base *)&lines) {
        pSVar2 = this->section;
        cVar14._M_node = (this->funcEnd)._M_node;
        nasm::Line::Line(&local_60,(Line *)(p_Var13 + 1));
        std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
        emplace<mocker::nasm::Line>(&pSVar2->lines,cVar14,&local_60);
        nasm::Line::~Line(&local_60);
        bVar3 = !bVar18;
        bVar18 = true;
        if (bVar3) {
          (this->funcBeg)._M_node = ((this->funcBeg)._M_node)->_M_prev;
          bVar18 = true;
        }
      }
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&s._M_h);
      std::__cxx11::_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::_M_clear
                (&lines.super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>);
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&offsets._M_h);
      return;
    }
    std::dynamic_pointer_cast<mocker::nasm::BinaryInst,mocker::nasm::Inst>
              ((shared_ptr<mocker::nasm::Inst> *)&offsets);
    if ((offsets._M_h._M_buckets == (__buckets_ptr)0x0) ||
       (*(int *)(offsets._M_h._M_buckets + 1) != 4)) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    else {
      std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
                ((shared_ptr<mocker::nasm::Addr> *)&s);
      pp_Var5 = s._M_h._M_buckets;
      psVar8 = nasm::rsp();
      _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (pp_Var5 + 1),
                              &((psVar8->
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->identifier);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s._M_h._M_bucket_count);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
      if (_Var7) {
        cVar9._M_node = (this->funcEnd)._M_node;
        goto LAB_0012e74e;
      }
    }
    cVar14._M_node = (cVar14._M_node)->_M_next;
  } while( true );
}

Assistant:

void RegisterAllocator::rewriteProgram(const std::vector<Node> &toBeSpilled) {
  // find sub rsp
  LineIter iter;
  for (iter = funcBeg; iter != funcEnd; ++iter) {
    auto inst = nasm::dyc<nasm::BinaryInst>(iter->inst);
    if (!inst || inst->getType() != nasm::BinaryInst::Sub)
      continue;
    auto reg = nasm::dyc<nasm::Register>(inst->getLhs());
    if (reg->getIdentifier() == nasm::rsp()->getIdentifier())
      break;
  }

  std::size_t baseOffset = 0;
  RegMap<std::shared_ptr<nasm::MemoryAddr>> offsets;

  // An sub-rsp instruction exists
  if (iter != funcEnd) {
    auto inst = nasm::dyc<nasm::BinaryInst>(iter->inst);
    baseOffset = nasm::dyc<nasm::NumericConstant>(inst->getRhs())->getVal();
    int64_t alignSz = baseOffset + 8 * toBeSpilled.size() +
                      (16 - (8 * toBeSpilled.size()) % 16);
    auto label = iter->label;
    auto pos = section.erase(iter);
    auto newSubRsp = std::make_shared<nasm::BinaryInst>(
        nasm::BinaryInst::Sub, nasm::rsp(),
        std::make_shared<nasm::NumericConstant>(alignSz));
    section.appendLine(pos, nasm::Line(label, newSubRsp));

  } else {
    for (iter = funcBeg; iter != funcEnd; ++iter) {
      if (iter->inst)
        break;
    }
    // The first two instructions of a function are always
    // push  %rbp
    // mov   %rbp, %rsp
    ++iter;
    ++iter;
    int64_t alignSz = baseOffset + 8 * toBeSpilled.size() +
                      (16 - (8 * toBeSpilled.size()) % 16);
    auto newSubRsp = std::make_shared<nasm::BinaryInst>(
        nasm::BinaryInst::Sub, nasm::rsp(),
        std::make_shared<nasm::NumericConstant>(alignSz));
    section.appendLine(iter, nasm::Line("", newSubRsp));
  }

  for (std::size_t i = 0, sz = toBeSpilled.size(); i < sz; ++i) {
    offsets[toBeSpilled[i]] = std::make_shared<nasm::MemoryAddr>(
        nasm::rbp(), -((int)baseOffset + 8 * (i + 1)));
  }

  std::size_t vRegCnt = 0;
  auto newVReg = [&vRegCnt](const std::string &hint) {
    return std::make_shared<nasm::Register>(hint + "_" +
                                            std::to_string(vRegCnt++));
  };
  std::list<nasm::Line> lines;
  RegSet s(toBeSpilled.begin(), toBeSpilled.end());
  for (iter = funcBeg; iter != funcEnd; ++iter) {
    auto inst = iter->inst;
    if (!inst) {
      lines.emplace_back(*iter);
      continue;
    }
    RegMap<Node> mp;
    for (auto &reg : nasm::getInvolvedRegs(inst)) {
      if (!isIn(s, reg))
        continue;
      mp[reg] = newVReg(reg->getIdentifier());
    }
    for (auto &reg : nasm::getUsedRegs(inst)) {
      if (!isIn(s, reg))
        continue;
      auto load = std::make_shared<nasm::Mov>(mp.at(reg), offsets.at(reg));
      lines.emplace_back(load);
    }
    auto newInst = nasm::replaceRegs(inst, mp);
    lines.emplace_back(iter->label, newInst);
    for (auto &reg : nasm::getDefinedRegs(inst)) {
      if (!isIn(s, reg))
        continue;
      auto storeBack = std::make_shared<nasm::Mov>(offsets.at(reg), mp.at(reg));
      lines.emplace_back(storeBack);
    }
  }

  funcBeg = funcEnd = section.erase(funcBeg, funcEnd);
  bool flag = false;
  for (auto &line : lines) {
    section.appendLine(funcEnd, std::move(line));
    if (!flag) {
      flag = true;
      --funcBeg;
    }
  }
}